

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction_X86.h
# Opt level: O2

bool __thiscall x86Argument::operator==(x86Argument *this,x86Argument *r)

{
  undefined1 auVar1 [16];
  
  if ((this->type == r->type) && ((this->field_1).reg == (r->field_1).reg)) {
    auVar1[0] = -((char)this->ptrBase == (char)r->ptrBase);
    auVar1[1] = -(*(byte *)((long)&this->ptrBase + 1) == *(byte *)((long)&r->ptrBase + 1));
    auVar1[2] = -(*(byte *)((long)&this->ptrBase + 2) == *(byte *)((long)&r->ptrBase + 2));
    auVar1[3] = -(*(byte *)((long)&this->ptrBase + 3) == *(byte *)((long)&r->ptrBase + 3));
    auVar1[4] = -((char)this->ptrIndex == (char)r->ptrIndex);
    auVar1[5] = -(*(byte *)((long)&this->ptrIndex + 1) == *(byte *)((long)&r->ptrIndex + 1));
    auVar1[6] = -(*(byte *)((long)&this->ptrIndex + 2) == *(byte *)((long)&r->ptrIndex + 2));
    auVar1[7] = -(*(byte *)((long)&this->ptrIndex + 3) == *(byte *)((long)&r->ptrIndex + 3));
    auVar1[8] = -((char)this->ptrMult == (char)r->ptrMult);
    auVar1[9] = -(*(char *)((long)&this->ptrMult + 1) == *(char *)((long)&r->ptrMult + 1));
    auVar1[10] = -(*(char *)((long)&this->ptrMult + 2) == *(char *)((long)&r->ptrMult + 2));
    auVar1[0xb] = -(*(char *)((long)&this->ptrMult + 3) == *(char *)((long)&r->ptrMult + 3));
    auVar1[0xc] = -((char)this->ptrNum == (char)r->ptrNum);
    auVar1[0xd] = -(*(char *)((long)&this->ptrNum + 1) == *(char *)((long)&r->ptrNum + 1));
    auVar1[0xe] = -(*(char *)((long)&this->ptrNum + 2) == *(char *)((long)&r->ptrNum + 2));
    auVar1[0xf] = -(*(char *)((long)&this->ptrNum + 3) == *(char *)((long)&r->ptrNum + 3));
    return (ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar1[0xf] >> 7) << 0xf) == 0xffff;
  }
  return false;
}

Assistant:

bool operator==(const x86Argument& r)
	{
		if(type != r.type || reg != r.reg)
			return false;

		if(ptrSize != r.ptrSize || ptrBase != r.ptrBase || ptrIndex != r.ptrIndex || ptrMult != r.ptrMult || ptrNum != r.ptrNum)
			return false;

		return true;
	}